

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc_comp_ellbvp.h
# Opt level: O3

void __thiscall
lf::uscalfe::
ReactionDiffusionElementMatrixProvider<std::complex<double>,_lf::mesh::utils::MeshFunctionConstant<std::complex<double>_>,_lf::mesh::utils::MeshFunctionConstant<std::complex<double>_>_>
::ReactionDiffusionElementMatrixProvider
          (ReactionDiffusionElementMatrixProvider<std::complex<double>,_lf::mesh::utils::MeshFunctionConstant<std::complex<double>_>,_lf::mesh::utils::MeshFunctionConstant<std::complex<double>_>_>
           *this,shared_ptr<const_lf::uscalfe::UniformScalarFESpace<std::complex<double>_>_>
                 *fe_space,MeshFunctionConstant<std::complex<double>_> alpha,
          MeshFunctionConstant<std::complex<double>_> gamma)

{
  RefEl ref_el_type;
  int iVar1;
  ScalarReferenceFiniteElement<std::complex<double>_> *fe;
  long lVar2;
  QuadRule *this_00;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  RefElType local_e2 [2];
  array<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<std::complex<double>_>,_5UL> *local_e0;
  shared_ptr<const_lf::uscalfe::UniformScalarFESpace<std::complex<double>_>_> *local_d8;
  QuadRule local_d0;
  PrecomputedScalarReferenceFiniteElement<std::complex<double>_> local_a0;
  
  this->_vptr_ReactionDiffusionElementMatrixProvider = (_func_int **)&PTR_isActive_0052f600;
  *(ulong *)(this->alpha_).value_._M_value = CONCAT44(in_XMM0_Db,in_XMM0_Da);
  *(undefined8 *)((this->alpha_).value_._M_value + 8) = in_XMM1_Qa;
  *(undefined8 *)(this->gamma_).value_._M_value = in_XMM2_Qa;
  *(undefined8 *)((this->gamma_).value_._M_value + 8) = in_XMM3_Qa;
  local_e0 = &this->fe_precomp_;
  lVar2 = 0;
  local_d8 = fe_space;
  memset(local_e0,0,0x230);
  this_00 = &(this->fe_precomp_)._M_elems[0].qr_;
  do {
    this_00[-1].weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_data = (double *)&PTR__PrecomputedScalarReferenceFiniteElement_0052f638;
    this_00[-1].weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = 0;
    quad::QuadRule::QuadRule(this_00);
    this_00[1].weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_data = (double *)0x0;
    this_00[1].weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = 0;
    this_00[1].points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = 0;
    this_00[1].points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = 0;
    this_00[1].ref_el_ = 0;
    *(undefined3 *)&this_00[1].field_0x1 = 0;
    this_00[1].degree_ = 0;
    this_00[1].points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)0x0;
    lVar2 = lVar2 + -0x70;
    this_00 = (QuadRule *)
              &this_00[2].points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
  } while (lVar2 != -0x230);
  local_e2[0] = kTria;
  local_e2[1] = kQuad;
  lVar2 = 0;
  do {
    ref_el_type.type_ = local_e2[lVar2];
    fe = UniformScalarFESpace<std::complex<double>_>::ShapeFunctionLayout
                   ((local_d8->
                    super___shared_ptr<const_lf::uscalfe::UniformScalarFESpace<std::complex<double>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr,ref_el_type);
    if (fe != (ScalarReferenceFiniteElement<std::complex<double>_> *)0x0) {
      iVar1 = (*fe->_vptr_ScalarReferenceFiniteElement[3])(fe);
      quad::make_QuadRule(&local_d0,ref_el_type,iVar1 * 2);
      PrecomputedScalarReferenceFiniteElement<std::complex<double>_>::
      PrecomputedScalarReferenceFiniteElement(&local_a0,fe,&local_d0);
      PrecomputedScalarReferenceFiniteElement<std::complex<double>_>::operator=
                (local_e0->_M_elems + ref_el_type.type_,&local_a0);
      PrecomputedScalarReferenceFiniteElement<std::complex<double>_>::
      ~PrecomputedScalarReferenceFiniteElement(&local_a0);
      free(local_d0.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      free(local_d0.points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 2);
  return;
}

Assistant:

ReactionDiffusionElementMatrixProvider<SCALAR, DIFF_COEFF, REACTION_COEFF>::
    ReactionDiffusionElementMatrixProvider(
        std::shared_ptr<const UniformScalarFESpace<SCALAR>> fe_space,
        DIFF_COEFF alpha, REACTION_COEFF gamma)
    : alpha_(std::move(alpha)), gamma_(std::move(gamma)), fe_precomp_() {
  for (auto ref_el : {base::RefEl::kTria(), base::RefEl::kQuad()}) {
    auto fe = fe_space->ShapeFunctionLayout(ref_el);
    // Check whether shape functions for that entity type are available.
    // Note that the corresponding PrecomputedScalarReferenceFiniteElement local
    // object is not initialized if the associated description of local shape
    // functions is missing.
    if (fe != nullptr) {
      // Precompute cell-independent quantities based on quadrature rules
      // with twice the degree of exactness compared to the degree of the
      // finite element space.
      fe_precomp_[ref_el.Id()] = PrecomputedScalarReferenceFiniteElement(
          fe, quad::make_QuadRule(ref_el, 2 * fe->Degree()));
    }
  }
}